

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_assert.cc
# Opt level: O0

void boost::assertion_failed(char *expr,char *param_2,char *file,long line)

{
  long lVar1;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  long local_28;
  long line_local;
  char *file_local;
  char *param_1_local;
  char *expr_local;
  
  local_28 = line;
  line_local = (long)file;
  file_local = param_2;
  param_1_local = expr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,expr,&local_49);
  lVar1 = line_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,(char *)lVar1,&local_81);
  lVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
  lf::base::AssertionFailed(&local_48,&local_80,lVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void assertion_failed(char const* expr, char const* /*function*/,
                      char const* file, long line) {
  lf::base::AssertionFailed(expr, file, line, "");
}